

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

QWindow * __thiscall QFbScreen::topLevelAt(QFbScreen *this,QPoint *p)

{
  bool bVar1;
  uint uVar2;
  QFbWindow **ppQVar3;
  bool in_SIL;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QFbWindow *fbw;
  QList<QFbWindow_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar5;
  QWindow *local_38;
  undefined1 local_30 [16];
  QFbWindow **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QFbWindow **)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<QFbWindow_*>::begin
                       ((QList<QFbWindow_*> *)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  local_18.i = (QFbWindow **)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<QFbWindow_*>::end
                       ((QList<QFbWindow_*> *)
                        CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  do {
    local_20 = local_18.i;
    bVar1 = QList<QFbWindow_*>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) {
      local_38 = (QWindow *)0x0;
LAB_00123c37:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_38;
    }
    ppQVar3 = QList<QFbWindow_*>::const_iterator::operator*(&local_10);
    auVar4 = (**(code **)(*(long *)*ppQVar3 + 0x30))();
    local_30 = auVar4;
    uVar2 = QRect::contains((QPoint *)local_30,in_SIL);
    bVar5 = 0;
    if ((uVar2 & 1) != 0) {
      QPlatformWindow::window();
      bVar5 = QWindow::isVisible();
    }
    if ((bVar5 & 1) != 0) {
      local_38 = (QWindow *)QPlatformWindow::window();
      goto LAB_00123c37;
    }
    QList<QFbWindow_*>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

QWindow *QFbScreen::topLevelAt(const QPoint & p) const
{
    for (QFbWindow *fbw : mWindowStack) {
        if (fbw->geometry().contains(p, false) && fbw->window()->isVisible())
            return fbw->window();
    }
    return nullptr;
}